

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::OrientedDiscMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float in_register_0000159c;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  RTCFilterFunctionNArguments local_330;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar54 [64];
  
  pSVar9 = context->scene;
  uVar25 = Disc->sharedGeomID;
  uVar27 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[uVar25].ptr;
  lVar11 = *(long *)&pGVar10->field_0x58;
  _Var12 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar26 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar31 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar31);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar27);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar32);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar26);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar35 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar30 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar30);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar34);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar43._16_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar33);
  auVar43._0_16_ = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar35);
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var13 = pGVar10[1].intersectionFilterN;
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar11 + uVar31 * (long)p_Var13);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar27 * (long)p_Var13);
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar11 + uVar32 * (long)p_Var13);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar26 * (long)p_Var13);
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar11 + uVar30 * (long)p_Var13);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar34 * (long)p_Var13);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var13 * uVar33);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar11 + uVar35 * (long)p_Var13);
  auVar45 = vunpcklps_avx(auVar36,auVar41);
  local_2e0 = vunpckhps_avx(auVar36,auVar41);
  auVar36 = vunpcklps_avx(auVar39,auVar43);
  auVar23 = vunpckhps_avx(auVar39,auVar43);
  auVar53 = vunpcklps_avx(auVar45,auVar36);
  auVar47 = vunpckhps_avx(auVar45,auVar36);
  auVar42 = vunpcklps_avx(local_2e0,auVar23);
  auVar39 = vunpcklps_avx(auVar51,auVar57);
  auVar45 = vunpckhps_avx(auVar51,auVar57);
  auVar41 = vunpcklps_avx(auVar55,auVar59);
  auVar36 = vunpckhps_avx(auVar55,auVar59);
  auVar51 = vunpcklps_avx(auVar45,auVar36);
  local_2a0 = vunpcklps_avx(auVar39,auVar41);
  local_1c0 = vunpckhps_avx(auVar39,auVar41);
  local_250 = vshufps_avx(ZEXT416(uVar25),ZEXT416(uVar25),0);
  local_260 = local_250;
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar1;
  auVar52._8_4_ = fVar1;
  auVar52._12_4_ = fVar1;
  auVar52._16_4_ = fVar1;
  auVar52._20_4_ = fVar1;
  auVar52._24_4_ = fVar1;
  auVar52._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar60._0_4_ = fVar2 * local_2a0._0_4_ + fVar3 * local_1c0._0_4_ + fVar4 * auVar51._0_4_;
  auVar60._4_4_ = fVar2 * local_2a0._4_4_ + fVar3 * local_1c0._4_4_ + fVar4 * auVar51._4_4_;
  auVar60._8_4_ = fVar2 * local_2a0._8_4_ + fVar3 * local_1c0._8_4_ + fVar4 * auVar51._8_4_;
  auVar60._12_4_ = fVar2 * local_2a0._12_4_ + fVar3 * local_1c0._12_4_ + fVar4 * auVar51._12_4_;
  auVar60._16_4_ = fVar2 * local_2a0._16_4_ + fVar3 * local_1c0._16_4_ + fVar4 * auVar51._16_4_;
  auVar60._20_4_ = fVar2 * local_2a0._20_4_ + fVar3 * local_1c0._20_4_ + fVar4 * auVar51._20_4_;
  auVar60._24_4_ = fVar2 * local_2a0._24_4_ + fVar3 * local_1c0._24_4_ + fVar4 * auVar51._24_4_;
  auVar60._28_4_ = in_register_0000159c + in_register_0000159c + 0.0;
  auVar36 = vcmpps_avx(auVar60,ZEXT432(0) << 0x20,0);
  auVar22 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar62._16_16_ = auVar22;
  auVar62._0_16_ = auVar22;
  auVar45 = vcvtdq2ps_avx(auVar62);
  auVar39 = vcmpps_avx(_DAT_01faff40,auVar45,1);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar64._16_4_ = 0x3f800000;
  auVar64._20_4_ = 0x3f800000;
  auVar64._24_4_ = 0x3f800000;
  auVar64._28_4_ = 0x3f800000;
  auVar45 = vblendvps_avx(auVar60,auVar64,auVar36);
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  auVar61._4_4_ = fVar5;
  auVar61._0_4_ = fVar5;
  auVar61._8_4_ = fVar5;
  auVar61._12_4_ = fVar5;
  auVar61._16_4_ = fVar5;
  auVar61._20_4_ = fVar5;
  auVar61._24_4_ = fVar5;
  auVar61._28_4_ = fVar5;
  auVar36 = vandnps_avx(auVar36,auVar39);
  auVar39 = vsubps_avx(auVar42,auVar61);
  auVar41 = vsubps_avx(auVar47,auVar52);
  fVar6 = *(float *)(ray + k * 4);
  auVar63._4_4_ = fVar6;
  auVar63._0_4_ = fVar6;
  auVar63._8_4_ = fVar6;
  auVar63._12_4_ = fVar6;
  auVar63._16_4_ = fVar6;
  auVar63._20_4_ = fVar6;
  auVar63._24_4_ = fVar6;
  auVar63._28_4_ = fVar6;
  auVar43 = vsubps_avx(auVar53,auVar63);
  auVar44._0_4_ =
       local_2a0._0_4_ * auVar43._0_4_ +
       auVar39._0_4_ * auVar51._0_4_ + local_1c0._0_4_ * auVar41._0_4_;
  auVar44._4_4_ =
       local_2a0._4_4_ * auVar43._4_4_ +
       auVar39._4_4_ * auVar51._4_4_ + local_1c0._4_4_ * auVar41._4_4_;
  auVar44._8_4_ =
       local_2a0._8_4_ * auVar43._8_4_ +
       auVar39._8_4_ * auVar51._8_4_ + local_1c0._8_4_ * auVar41._8_4_;
  auVar44._12_4_ =
       local_2a0._12_4_ * auVar43._12_4_ +
       auVar39._12_4_ * auVar51._12_4_ + local_1c0._12_4_ * auVar41._12_4_;
  auVar44._16_4_ =
       local_2a0._16_4_ * auVar43._16_4_ +
       auVar39._16_4_ * auVar51._16_4_ + local_1c0._16_4_ * auVar41._16_4_;
  auVar44._20_4_ =
       local_2a0._20_4_ * auVar43._20_4_ +
       auVar39._20_4_ * auVar51._20_4_ + local_1c0._20_4_ * auVar41._20_4_;
  auVar44._24_4_ =
       local_2a0._24_4_ * auVar43._24_4_ +
       auVar39._24_4_ * auVar51._24_4_ + local_1c0._24_4_ * auVar41._24_4_;
  auVar44._28_4_ = auVar43._28_4_ + auVar39._28_4_ + auVar41._28_4_;
  local_200 = vdivps_avx(auVar44,auVar45);
  auVar50 = ZEXT3264(local_200);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar45._4_4_ = uVar7;
  auVar45._0_4_ = uVar7;
  auVar45._8_4_ = uVar7;
  auVar45._12_4_ = uVar7;
  auVar45._16_4_ = uVar7;
  auVar45._20_4_ = uVar7;
  auVar45._24_4_ = uVar7;
  auVar45._28_4_ = uVar7;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_280._4_4_ = uVar7;
  local_280._0_4_ = uVar7;
  local_280._8_4_ = uVar7;
  local_280._12_4_ = uVar7;
  local_280._16_4_ = uVar7;
  local_280._20_4_ = uVar7;
  local_280._24_4_ = uVar7;
  local_280._28_4_ = uVar7;
  auVar45 = vcmpps_avx(auVar45,local_200,2);
  auVar39 = vcmpps_avx(local_200,local_280,2);
  auVar45 = vandps_avx(auVar45,auVar39);
  auVar41 = auVar36 & auVar45;
  if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar41 >> 0x7f,0) != '\0') ||
        (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar41 >> 0xbf,0) != '\0') ||
      (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar41[0x1f] < '\0') {
    auVar45 = vandps_avx(auVar45,auVar36);
    auVar43 = vunpckhps_avx(local_2e0,auVar23);
    fVar14 = local_200._0_4_;
    fVar15 = local_200._4_4_;
    fVar16 = local_200._8_4_;
    fVar17 = local_200._12_4_;
    fVar18 = local_200._16_4_;
    fVar19 = local_200._20_4_;
    fVar20 = local_200._24_4_;
    auVar46._0_4_ = fVar6 + fVar2 * fVar14;
    auVar46._4_4_ = fVar6 + fVar2 * fVar15;
    auVar46._8_4_ = fVar6 + fVar2 * fVar16;
    auVar46._12_4_ = fVar6 + fVar2 * fVar17;
    auVar46._16_4_ = fVar6 + fVar2 * fVar18;
    auVar46._20_4_ = fVar6 + fVar2 * fVar19;
    auVar46._24_4_ = fVar6 + fVar2 * fVar20;
    auVar46._28_4_ = fVar6 + auVar39._28_4_;
    auVar49._0_4_ = fVar1 + fVar3 * fVar14;
    auVar49._4_4_ = fVar1 + fVar3 * fVar15;
    auVar49._8_4_ = fVar1 + fVar3 * fVar16;
    auVar49._12_4_ = fVar1 + fVar3 * fVar17;
    auVar49._16_4_ = fVar1 + fVar3 * fVar18;
    auVar49._20_4_ = fVar1 + fVar3 * fVar19;
    auVar49._24_4_ = fVar1 + fVar3 * fVar20;
    auVar49._28_4_ = fVar1 + local_2a0._28_4_;
    auVar48._0_4_ = fVar5 + fVar4 * fVar14;
    auVar48._4_4_ = fVar5 + fVar4 * fVar15;
    auVar48._8_4_ = fVar5 + fVar4 * fVar16;
    auVar48._12_4_ = fVar5 + fVar4 * fVar17;
    auVar48._16_4_ = fVar5 + fVar4 * fVar18;
    auVar48._20_4_ = fVar5 + fVar4 * fVar19;
    auVar48._24_4_ = fVar5 + fVar4 * fVar20;
    auVar48._28_4_ = fVar5 + auVar23._28_4_;
    auVar36 = vsubps_avx(auVar46,auVar53);
    auVar39 = vsubps_avx(auVar49,auVar47);
    auVar41 = vsubps_avx(auVar48,auVar42);
    auVar47._0_4_ =
         auVar36._0_4_ * auVar36._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar41._0_4_ * auVar41._0_4_;
    auVar47._4_4_ =
         auVar36._4_4_ * auVar36._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar41._4_4_ * auVar41._4_4_;
    auVar47._8_4_ =
         auVar36._8_4_ * auVar36._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar41._8_4_ * auVar41._8_4_;
    auVar47._12_4_ =
         auVar36._12_4_ * auVar36._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar41._12_4_ * auVar41._12_4_;
    auVar47._16_4_ =
         auVar36._16_4_ * auVar36._16_4_ +
         auVar39._16_4_ * auVar39._16_4_ + auVar41._16_4_ * auVar41._16_4_;
    auVar47._20_4_ =
         auVar36._20_4_ * auVar36._20_4_ +
         auVar39._20_4_ * auVar39._20_4_ + auVar41._20_4_ * auVar41._20_4_;
    auVar47._24_4_ =
         auVar36._24_4_ * auVar36._24_4_ +
         auVar39._24_4_ * auVar39._24_4_ + auVar41._24_4_ * auVar41._24_4_;
    auVar47._28_4_ = auVar36._28_4_ + auVar39._28_4_ + auVar41._28_4_;
    auVar23._4_4_ = auVar43._4_4_ * auVar43._4_4_;
    auVar23._0_4_ = auVar43._0_4_ * auVar43._0_4_;
    auVar23._8_4_ = auVar43._8_4_ * auVar43._8_4_;
    auVar23._12_4_ = auVar43._12_4_ * auVar43._12_4_;
    auVar23._16_4_ = auVar43._16_4_ * auVar43._16_4_;
    auVar23._20_4_ = auVar43._20_4_ * auVar43._20_4_;
    auVar23._24_4_ = auVar43._24_4_ * auVar43._24_4_;
    auVar23._28_4_ = auVar43._28_4_;
    auVar36 = vcmpps_avx(auVar47,auVar23,1);
    auVar39 = auVar45 & auVar36;
    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0x7f,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar39 >> 0xbf,0) != '\0') ||
        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar39[0x1f] < '\0')
    {
      local_2c0 = vandps_avx(auVar45,auVar36);
      local_220 = ZEXT832(0) << 0x20;
      local_240 = ZEXT832(0) << 0x20;
      local_1e0 = local_2a0._0_8_;
      uStack_1d8 = local_2a0._8_8_;
      uStack_1d0 = local_2a0._16_8_;
      uStack_1c8 = local_2a0._24_8_;
      local_300._0_8_ = auVar51._0_8_;
      local_300._8_8_ = auVar51._8_8_;
      local_300._16_8_ = auVar51._16_8_;
      local_300._24_8_ = auVar51._24_8_;
      local_1a0 = local_300._0_8_;
      uStack_198 = local_300._8_8_;
      uStack_190 = local_300._16_8_;
      uStack_188 = local_300._24_8_;
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      auVar53._16_4_ = 0x7f800000;
      auVar53._20_4_ = 0x7f800000;
      auVar53._24_4_ = 0x7f800000;
      auVar53._28_4_ = 0x7f800000;
      auVar54 = ZEXT3264(auVar53);
      auVar45 = vblendvps_avx(auVar53,local_200,local_2c0);
      auVar36 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar36 = vminps_avx(auVar45,auVar36);
      auVar39 = vshufpd_avx(auVar36,auVar36,5);
      auVar36 = vminps_avx(auVar36,auVar39);
      auVar39 = vperm2f128_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar36,auVar39);
      auVar36 = vcmpps_avx(auVar45,auVar36,0);
      auVar39 = local_2c0 & auVar36;
      auVar45 = local_2c0;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar45 = vandps_avx(auVar36,local_2c0);
      }
      uVar24 = vmovmskps_avx(auVar45);
      uVar28 = 1 << ((byte)k & 0x1f);
      uVar25 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      pauVar29 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar28 >> 4) * 0x10);
      auVar45 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar56 = ZEXT3264(auVar45);
      auVar58 = ZEXT464(0) << 0x20;
      do {
        local_330.hit = local_180;
        local_330.valid = (int *)local_380;
        uVar26 = (ulong)uVar25;
        uVar25 = *(uint *)(local_260 + uVar26 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar25].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_2c0 + uVar26 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar7 = *(undefined4 *)(local_240 + uVar26 * 4);
            uVar8 = *(undefined4 *)(local_220 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)&local_1e0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1c0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)&local_1a0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar7;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar8;
            *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[uVar26];
            *(uint *)(ray + k * 4 + 0x240) = uVar25;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          local_120 = *(undefined4 *)(local_240 + uVar26 * 4);
          local_100 = *(undefined4 *)(local_220 + uVar26 * 4);
          auStack_b0 = vpshufd_avx(ZEXT416(uVar25),0);
          local_e0 = (Disc->primIDs).field_0.i[uVar26];
          uVar7 = *(undefined4 *)((long)&local_1e0 + uVar26 * 4);
          uVar8 = *(undefined4 *)(local_1c0 + uVar26 * 4);
          local_160._4_4_ = uVar8;
          local_160._0_4_ = uVar8;
          local_160._8_4_ = uVar8;
          local_160._12_4_ = uVar8;
          local_160._16_4_ = uVar8;
          local_160._20_4_ = uVar8;
          local_160._24_4_ = uVar8;
          local_160._28_4_ = uVar8;
          uVar8 = *(undefined4 *)((long)&local_1a0 + uVar26 * 4);
          local_140._4_4_ = uVar8;
          local_140._0_4_ = uVar8;
          local_140._8_4_ = uVar8;
          local_140._12_4_ = uVar8;
          local_140._16_4_ = uVar8;
          local_140._20_4_ = uVar8;
          local_140._24_4_ = uVar8;
          local_140._28_4_ = uVar8;
          local_180[0] = (RTCHitN)(char)uVar7;
          local_180[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar7;
          local_180[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar7;
          local_180[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar7;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar7;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar7;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar7;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar7;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          local_300 = auVar56._0_32_;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar26 * 4);
          local_380 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar28 & 0xf) << 4));
          local_370 = *pauVar29;
          local_330.geometryUserPtr = pGVar10->userPtr;
          local_330.context = context->user;
          local_330.N = 8;
          local_330.ray = (RTCRayN *)ray;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_2a0._0_8_ = Disc;
            local_360 = auVar50._0_32_;
            local_2e0._0_8_ = pauVar29;
            (*pGVar10->intersectionFilterN)(&local_330);
            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar56 = ZEXT3264(local_300);
            auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar50 = ZEXT3264(local_360);
            pauVar29 = (undefined1 (*) [16])local_2e0._0_8_;
            Disc = (Primitive *)local_2a0._0_8_;
          }
          auVar22 = vpcmpeqd_avx(auVar58._0_16_,local_380);
          auVar21 = vpcmpeqd_avx(auVar58._0_16_,local_370);
          auVar42._16_16_ = auVar21;
          auVar42._0_16_ = auVar22;
          local_300 = auVar56._0_32_;
          auVar45 = local_300 & ~auVar42;
          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar45 >> 0x7f,0) == '\0') &&
                (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar45 >> 0xbf,0) == '\0') &&
              (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar45[0x1f]) {
            auVar37._0_4_ = auVar56._0_4_ ^ auVar22._0_4_;
            auVar37._4_4_ = auVar56._4_4_ ^ auVar22._4_4_;
            auVar37._8_4_ = auVar56._8_4_ ^ auVar22._8_4_;
            auVar37._12_4_ = auVar56._12_4_ ^ auVar22._12_4_;
            auVar37._16_4_ = auVar56._16_4_ ^ auVar21._0_4_;
            auVar37._20_4_ = auVar56._20_4_ ^ auVar21._4_4_;
            auVar37._24_4_ = auVar56._24_4_ ^ auVar21._8_4_;
            auVar37._28_4_ = auVar56._28_4_ ^ auVar21._12_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_360 = auVar50._0_32_;
              local_2e0._0_8_ = pauVar29;
              (*p_Var13)(&local_330);
              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar56 = ZEXT3264(local_300);
              auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar50 = ZEXT3264(local_360);
              pauVar29 = (undefined1 (*) [16])local_2e0._0_8_;
            }
            auVar22 = vpcmpeqd_avx(auVar58._0_16_,local_380);
            auVar21 = vpcmpeqd_avx(auVar58._0_16_,local_370);
            auVar40._16_16_ = auVar21;
            auVar40._0_16_ = auVar22;
            auVar37._0_4_ = auVar56._0_4_ ^ auVar22._0_4_;
            auVar37._4_4_ = auVar56._4_4_ ^ auVar22._4_4_;
            auVar37._8_4_ = auVar56._8_4_ ^ auVar22._8_4_;
            auVar37._12_4_ = auVar56._12_4_ ^ auVar22._12_4_;
            auVar37._16_4_ = auVar56._16_4_ ^ auVar21._0_4_;
            auVar37._20_4_ = auVar56._20_4_ ^ auVar21._4_4_;
            auVar37._24_4_ = auVar56._24_4_ ^ auVar21._8_4_;
            auVar37._28_4_ = auVar56._28_4_ ^ auVar21._12_4_;
            auVar45 = auVar56._0_32_ & ~auVar40;
            if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar45 >> 0x7f,0) != '\0') ||
                  (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar45 >> 0xbf,0) != '\0') ||
                (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar45[0x1f] < '\0') {
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])local_330.hit);
              *(undefined1 (*) [32])(local_330.ray + 0x180) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0x20));
              *(undefined1 (*) [32])(local_330.ray + 0x1a0) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0x40));
              *(undefined1 (*) [32])(local_330.ray + 0x1c0) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0x60));
              *(undefined1 (*) [32])(local_330.ray + 0x1e0) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0x80));
              *(undefined1 (*) [32])(local_330.ray + 0x200) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0xa0));
              *(undefined1 (*) [32])(local_330.ray + 0x220) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0xc0));
              *(undefined1 (*) [32])(local_330.ray + 0x240) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0xe0));
              *(undefined1 (*) [32])(local_330.ray + 0x260) = auVar45;
              auVar45 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])(local_330.hit + 0x100));
              *(undefined1 (*) [32])(local_330.ray + 0x280) = auVar45;
            }
          }
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0x7f,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar37 >> 0xbf,0) == '\0') &&
              (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar37[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = local_280._0_4_;
            auVar45 = local_280;
          }
          else {
            auVar45 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_2c0 + uVar26 * 4) = 0;
          auVar22 = vshufps_avx(auVar45._0_16_,auVar45._0_16_,0);
          auVar38._16_16_ = auVar22;
          auVar38._0_16_ = auVar22;
          auVar36 = vcmpps_avx(auVar50._0_32_,auVar38,2);
          local_2c0 = vandps_avx(auVar36,local_2c0);
          local_280 = auVar45;
        }
        if ((((((((local_2c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_2c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_2c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_2c0 >> 0x7f,0) == '\0') &&
              (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_2c0 >> 0xbf,0) == '\0') &&
            (local_2c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_2c0[0x1f]) {
          return;
        }
        auVar45 = vblendvps_avx(auVar54._0_32_,auVar50._0_32_,local_2c0);
        auVar36 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar36 = vminps_avx(auVar45,auVar36);
        auVar39 = vshufpd_avx(auVar36,auVar36,5);
        auVar36 = vminps_avx(auVar36,auVar39);
        auVar39 = vperm2f128_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar36,auVar39);
        auVar36 = vcmpps_avx(auVar45,auVar36,0);
        auVar39 = local_2c0 & auVar36;
        auVar45 = local_2c0;
        if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0x7f,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0xbf,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar39[0x1f] < '\0') {
          auVar45 = vandps_avx(auVar36,local_2c0);
        }
        uVar24 = vmovmskps_avx(auVar45);
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }